

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sfmLib.c
# Opt level: O1

int Sfm_LibFindComplInputGate(Vec_Wrd_t *vFuncs,int iGate,int nFanins,int iFanin,int *piFaninNew)

{
  word *pwVar1;
  ulong uVar2;
  long lVar3;
  byte bVar4;
  byte bVar5;
  uint uVar6;
  ulong uVar7;
  
  if ((iGate < 0) || (vFuncs->nSize <= iGate)) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  pwVar1 = vFuncs->pArray;
  uVar7 = pwVar1[(uint)iGate];
  uVar2 = Exp_Truth6::Truth6[iFanin];
  bVar4 = (byte)(1 << ((byte)iFanin & 0x1f));
  if ((iFanin < 0) || (nFanins <= iFanin)) {
    __assert_fail("iFanin >= 0 && iFanin < nFanins",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/opt/sfm/sfmLib.c"
                  ,0xa6,"int Sfm_LibFindComplInputGate(Vec_Wrd_t *, int, int, int, int *)");
  }
  if (piFaninNew != (int *)0x0) {
    *piFaninNew = iFanin;
  }
  uVar7 = (uVar2 & uVar7) >> (bVar4 & 0x3f) | uVar2 & uVar7 << (bVar4 & 0x3f);
  if (0 < (long)vFuncs->nSize) {
    lVar3 = 0;
    do {
      if (pwVar1[lVar3] == uVar7) goto LAB_004b7d8e;
      lVar3 = lVar3 + 1;
    } while (vFuncs->nSize != lVar3);
  }
  uVar6 = iFanin - 1;
  if (iFanin != 0) {
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = uVar6;
    }
    bVar5 = (byte)(1 << ((byte)uVar6 & 0x1f));
    if (0 < (long)vFuncs->nSize) {
      lVar3 = 0;
      do {
        if (pwVar1[lVar3] ==
            ((s_PMasks[uVar6][1] & uVar7) << (bVar5 & 0x3f) | s_PMasks[uVar6][0] & uVar7 |
            (s_PMasks[uVar6][2] & uVar7) >> (bVar5 & 0x3f))) goto LAB_004b7d8e;
        lVar3 = lVar3 + 1;
      } while (vFuncs->nSize != lVar3);
    }
  }
  if (iFanin + 1 < nFanins) {
    if (piFaninNew != (int *)0x0) {
      *piFaninNew = iFanin + 1;
    }
    if (0 < (long)vFuncs->nSize) {
      lVar3 = 0;
      do {
        if (pwVar1[lVar3] ==
            ((s_PMasks[(uint)iFanin][1] & uVar7) << (bVar4 & 0x3f) |
             uVar7 & s_PMasks[(uint)iFanin][0] |
            (s_PMasks[(uint)iFanin][2] & uVar7) >> (bVar4 & 0x3f))) goto LAB_004b7d8e;
        lVar3 = lVar3 + 1;
      } while (vFuncs->nSize != lVar3);
    }
  }
  lVar3 = 0xffffffff;
  if (piFaninNew != (int *)0x0) {
    *piFaninNew = -1;
  }
LAB_004b7d8e:
  return (int)lVar3;
}

Assistant:

int Sfm_LibFindComplInputGate( Vec_Wrd_t * vFuncs, int iGate, int nFanins, int iFanin, int * piFaninNew )
{
    word uTruthGate = Vec_WrdEntry( vFuncs, iGate );
    word uTruthFlip = Abc_Tt6Flip( uTruthGate, iFanin ); 
    word uTruth, uTruthSwap;  int i;
    assert( iFanin >= 0 && iFanin < nFanins );
    if ( piFaninNew ) *piFaninNew = iFanin;
    Vec_WrdForEachEntry( vFuncs, uTruth, i )
        if ( uTruth == uTruthFlip )
            return i;
    if ( iFanin-1 >= 0 )
    {
        if ( piFaninNew ) *piFaninNew = iFanin-1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin-1 );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    if ( iFanin+1 < nFanins )
    {
        if ( piFaninNew ) *piFaninNew = iFanin+1;
        uTruthSwap = Abc_Tt6SwapAdjacent( uTruthFlip, iFanin );
        Vec_WrdForEachEntry( vFuncs, uTruth, i )
            if ( uTruth == uTruthSwap )
                return i;
    }
    // add checking for complemeting control input of a MUX
    if ( piFaninNew ) *piFaninNew = -1;
    return -1;
}